

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_lambda(char *fn,float32 min,float32 max)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  uint32 n_lmb;
  float32 *lmb;
  
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
          ,0x73,"Reading %s\n",fn);
  iVar2 = s3lamb_read(fn,&lmb,&n_lmb);
  if (iVar2 == 0) {
    iVar2 = 0;
    for (uVar3 = 0; uVar3 < n_lmb; uVar3 = uVar3 + 1) {
      fVar1 = (float)lmb[uVar3];
      if (((float)min <= fVar1) && (fVar1 <= (float)max)) {
        printf("%u: %0.4f\n",(double)fVar1,uVar3 & 0xffffffff);
      }
    }
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
print_lambda(const char *fn, float32 min, float32 max)
{
    float32 *lmb;
    uint32 n_lmb;
    uint32 i;

    E_INFO("Reading %s\n",  fn);

    if (s3lamb_read(fn, &lmb, &n_lmb) != S3_SUCCESS)
	return S3_ERROR;

    for (i = 0; i < n_lmb; i++) {
	if ((lmb[i] >= min) && (lmb[i] <= max))
	    printf("%u: %0.4f\n", i, lmb[i]);
    }

    return S3_SUCCESS;
}